

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcColourRgb::~IfcColourRgb(IfcColourRgb *this)

{
  *(undefined8 *)&this[-1].super_IfcColourSpecification.field_0x40 = 0x954f68;
  *(undefined8 *)&(this->super_IfcColourSpecification).field_0x28 = 0x954f90;
  if ((undefined1 *)this[-1].Green != &this[-1].field_0x60) {
    operator_delete((undefined1 *)this[-1].Green,*(long *)&this[-1].field_0x60 + 1);
  }
  operator_delete(&this[-1].super_IfcColourSpecification.field_0x40,0x78);
  return;
}

Assistant:

IfcColourSpecification() : Object("IfcColourSpecification") {}